

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rg_demo.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  bool bVar1;
  CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *pCVar2;
  ostream *poVar3;
  long *plVar4;
  int iVar5;
  int *piVar6;
  Vector3i obs;
  RGRegion region;
  RGProblem subproblem;
  RGProblem problem;
  Scalar local_138;
  Matrix<int,_3,_1,_0,_3,_1> local_134;
  undefined1 local_128 [24];
  void *local_110;
  void *local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  void *local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_98;
  int local_90;
  undefined8 local_88;
  int local_80;
  undefined8 local_78;
  int local_70;
  undefined8 local_68;
  int local_60;
  undefined8 local_58;
  int local_50;
  undefined8 local_48;
  int local_40;
  undefined1 *local_3c;
  undefined4 local_34;
  
  local_c8 = (void *)0x0;
  uStack_c0 = 0;
  local_b8 = 0;
  local_3c = &DAT_300000003;
  local_34 = 3;
  rg::RGProblem::setSeedPoint();
  local_f8._0_4_ = 1;
  do {
    local_138 = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = 0;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          (Scalar *)&local_f8);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_138);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1))
      goto LAB_00101eab;
      local_48 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_40 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_48);
      bVar1 = local_138 < 3;
      local_138 = local_138 + 1;
    } while (bVar1);
    bVar1 = (int)local_f8 < 3;
    local_f8._0_4_ = (int)local_f8 + 1;
  } while (bVar1);
  local_f8._0_4_ = 1;
  do {
    local_138 = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = 5;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          (Scalar *)&local_f8);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_138);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1))
      goto LAB_00101eab;
      local_58 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_50 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_58);
      bVar1 = local_138 < 3;
      local_138 = local_138 + 1;
    } while (bVar1);
    bVar1 = (int)local_f8 < 3;
    local_f8._0_4_ = (int)local_f8 + 1;
  } while (bVar1);
  iVar5 = 1;
  do {
    local_f8._0_4_ = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_138 = 0;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = iVar5;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          &local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                (pCVar2,(Scalar *)&local_f8);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1))
      goto LAB_00101eab;
      local_68 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_60 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_68);
      bVar1 = (int)local_f8 < 3;
      local_f8._0_4_ = (int)local_f8 + 1;
    } while (bVar1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  iVar5 = 1;
  do {
    local_f8._0_4_ = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_138 = 5;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = iVar5;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          &local_138);
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                (pCVar2,(Scalar *)&local_f8);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1))
      goto LAB_00101eab;
      local_78 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_70 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_78);
      bVar1 = (int)local_f8 < 3;
      local_f8._0_4_ = (int)local_f8 + 1;
    } while (bVar1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  iVar5 = 1;
  do {
    local_f8._0_4_ = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = iVar5;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          (Scalar *)&local_f8);
      local_138 = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_138);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1))
      goto LAB_00101eab;
      local_88 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_80 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_88);
      bVar1 = (int)local_f8 < 3;
      local_f8._0_4_ = (int)local_f8 + 1;
    } while (bVar1);
    iVar5 = iVar5 + 1;
  } while (iVar5 != 4);
  iVar5 = 1;
  do {
    local_f8._0_4_ = 1;
    do {
      local_128._8_8_ = (pointer)0x0;
      local_128._16_8_ = (pointer)0x1;
      local_110 = (void *)0x1;
      local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0]
           = iVar5;
      local_128._0_8_ = &local_134;
      pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_
                         ((CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_> *)local_128,
                          (Scalar *)&local_f8);
      local_138 = 5;
      Eigen::CommaInitializer<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>::operator_(pCVar2,&local_138);
      if (((long)local_110 + local_128._8_8_ != 3) || ((pointer)local_128._16_8_ != (pointer)0x1)) {
LAB_00101eab:
        __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                      ,"/usr/include/eigen3/Eigen/src/Core/CommaInitializer.h",0x7c,
                      "XprType &Eigen::CommaInitializer<Eigen::Matrix<int, 3, 1>>::finished() [MatrixType = Eigen::Matrix<int, 3, 1>]"
                     );
      }
      local_98 = CONCAT44(local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[1],
                          local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array[0]);
      local_90 = local_134.super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array[2];
      rg::RGProblem::addObstacle(&local_c8,&local_98);
      bVar1 = (int)local_f8 < 3;
      local_f8._0_4_ = (int)local_f8 + 1;
    } while (bVar1);
    iVar5 = iVar5 + 1;
    if (iVar5 == 4) {
      local_f8 = (void *)0x0;
      uStack_f0 = 0;
      local_e8 = 0;
      local_128._0_8_ = &DAT_300000003;
      local_128._8_4_ = 3;
      rg::RGProblem::getSubproblem((Matrix *)&local_c8,(int)local_128,(RGProblem *)0xa);
      local_138 = 100;
      rg::inflate_region((RGProblem *)local_128,(RGOptions *)&local_c8);
      piVar6 = (int *)local_128._0_8_;
      if (local_128._0_8_ != local_128._8_8_) {
        do {
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             ((ostream *)&std::cout,
                              (((Matrix<int,_3,_1,_0,_3,_1> *)piVar6)->
                              super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.
                              m_data.array[0]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
          poVar3 = (ostream *)
                   std::ostream::operator<<
                             (poVar3,(((Matrix<int,_3,_1,_0,_3,_1> *)piVar6)->
                                     super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).
                                     m_storage.m_data.array[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar3,",",1);
          plVar4 = (long *)std::ostream::operator<<
                                     (poVar3,(((Matrix<int,_3,_1,_0,_3,_1> *)piVar6)->
                                             super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>
                                             ).m_storage.m_data.array[2]);
          std::ios::widen((char)*(undefined8 *)(*plVar4 + -0x18) + (char)plVar4);
          std::ostream::put((char)plVar4);
          std::ostream::flush();
          piVar6 = (((Matrix<int,_3,_1,_0,_3,_1> *)((long)piVar6 + 0xc))->
                   super_PlainObjectBase<Eigen::Matrix<int,_3,_1,_0,_3,_1>_>).m_storage.m_data.array
                   + 1;
        } while (piVar6 != (int *)local_128._8_8_);
      }
      if (local_110 != (void *)0x0) {
        operator_delete(local_110);
      }
      if ((Matrix<int,_3,_1,_0,_3,_1> *)local_128._0_8_ != (Matrix<int,_3,_1,_0,_3,_1> *)0x0) {
        operator_delete((void *)local_128._0_8_);
      }
      if (local_f8 != (void *)0x0) {
        operator_delete(local_f8);
      }
      if (local_c8 != (void *)0x0) {
        operator_delete(local_c8);
      }
      return 0;
    }
  } while( true );
}

Assistant:

int main(int argc, char** argv) {
  //test_is_required_point();
  
  
  rg::RGProblem problem;

  problem.setSeedPoint(Eigen::Vector3i(3, 3, 3));

  Eigen::Vector3i obs;

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 0, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << 5, i, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 0, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, 5, j;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  for (int i = 1; i < 4; i++)
  {
    for (int j = 1; j < 4; j++)
    {
      obs << i, j, 5;
      problem.addObstacle(obs);
    }
  }

  rg::RGProblem subproblem;
  problem.getSubproblem(Eigen::Vector3i(3, 3, 3), 10, &subproblem);
  //Eigen::Vector3i point = subproblem.getSeed();
  //std::cout << "sssss: " << point.x() << " " << point.y() << " " << point.z() << std::endl;
  //std::vector<Eigen::Vector3i> obstacles = problem.getObstacles();

  //for (auto it = obstacles.begin(); it != obstacles.end(); ++it)
  //{
  //  std::cout << it->x() << "," << it->y() << "," << it->z() << std::endl;
  //}

  rg::RGOptions options;

  options.iter_limit = 100;

  rg::RGRegion region = inflate_region(problem, options);

  for (auto it = region.region_bound_pts.begin(); it != region.region_bound_pts.end(); ++it)
  {
    std::cout << it->point.x() << "," << it->point.y() << "," << it->point.z() << std::endl;
  }



  return 0;
}